

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O0

Bbr2Mode __thiscall
quic::Bbr2ProbeBwMode::OnExitQuiescence
          (Bbr2ProbeBwMode *this,QuicTime now,QuicTime quiescence_start_time)

{
  Bbr2NetworkModel *this_00;
  Delta duration;
  Bbr2ProbeBwMode *this_local;
  QuicTime quiescence_start_time_local;
  QuicTime now_local;
  
  this_00 = (this->super_Bbr2ModeBase).model_;
  duration = operator-(now,quiescence_start_time);
  Bbr2NetworkModel::PostponeMinRttTimestamp(this_00,duration);
  return PROBE_BW;
}

Assistant:

Bbr2Mode Bbr2ProbeBwMode::OnExitQuiescence(QuicTime now,
                                           QuicTime quiescence_start_time) {
 /* QUIC_DVLOG(3) << sender_ << " Postponing min_rtt_timestamp("
                << model_->MinRttTimestamp() << ") by "
                << now - quiescence_start_time;*/
  model_->PostponeMinRttTimestamp(now - quiescence_start_time);
  return Bbr2Mode::PROBE_BW;
}